

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O0

map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* read_test_file(map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *__return_storage_ptr__,string *file_name)

{
  byte bVar1;
  bool bVar2;
  istream *this;
  long *plVar3;
  mapped_type *this_00;
  string local_298 [8];
  string rnum;
  uint32_t val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_220;
  ifstream ifs;
  string *file_name_local;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *roman_nums;
  
  std::ifstream::ifstream(&local_220,(string *)file_name,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,"\'",
                   file_name);
    std::operator+(&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   "\' could not be opened for reading.");
    error(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&val);
  }
  rnum.field_2._M_local_buf[0xf] = '\0';
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  rnum.field_2._8_4_ = 0;
  std::__cxx11::string::string(local_298);
  while( true ) {
    this = std::operator>>((istream *)&local_220,local_298);
    plVar3 = (long *)std::istream::operator>>
                               ((istream *)this,(uint *)(rnum.field_2._M_local_buf + 8));
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar2) break;
    this_00 = std::
              map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](__return_storage_ptr__,(key_type *)(rnum.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)this_00,local_298);
  }
  rnum.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_298);
  if ((rnum.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::map<uint32_t, std::string> read_test_file(const std::string& file_name)
{
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		error("'" + file_name + "' could not be opened for reading.");
	}
	std::map<uint32_t, std::string> roman_nums;
	uint32_t val{ 0 };
	std::string rnum;
	while (ifs >> rnum >> val)
	{
		roman_nums[val] = rnum;
	}
	return roman_nums;
}